

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TIMED_INC(effect_handler_context_t_conflict *context)

{
  monster *mon;
  loc_conflict grid;
  byte local_6d;
  byte local_65;
  wchar_t local_64;
  wchar_t local_54;
  wchar_t local_34;
  wchar_t wStack_30;
  wchar_t mon_tmd_effect;
  loc_conflict decoy;
  monster *t_mon;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  local_64 = effect_calculate_value(context,false);
  mon = monster_target_monster(context);
  grid = (loc_conflict)cave_find_decoy(cave);
  context->ident = true;
  if (((cave->mon_current < L'\x01') || (mon_tmd_effect = grid.y, mon_tmd_effect == L'\0')) ||
     (wStack_30 = grid.x, wStack_30 == L'\0')) {
    if (mon == (monster *)0x0) {
      if ((player->timed[context->subtype] == 0) || (context->other == 0)) {
        if (local_64 < L'\0') {
          local_64 = L'\0';
        }
        local_65 = 1;
        if ((context->origin).what == SRC_PLAYER) {
          local_65 = context->aware ^ 0xff;
        }
        player_inc_timed(player,context->subtype,local_64,true,(_Bool)(local_65 & 1),true);
      }
      else {
        local_6d = 1;
        if ((context->origin).what == SRC_PLAYER) {
          local_6d = context->aware ^ 0xff;
        }
        player_inc_timed(player,context->subtype,context->other,true,(_Bool)(local_6d & 1),true);
      }
    }
    else {
      local_34 = L'\xffffffff';
      switch(context->subtype) {
      case 1:
        local_34 = L'\x04';
        break;
      case 2:
        local_34 = L'\x01';
        break;
      case 3:
        local_34 = L'\x06';
        break;
      case 4:
        local_34 = L'\x02';
        break;
      case 5:
        local_34 = L'\x03';
        break;
      default:
        break;
      case 0x19:
        local_34 = L'\0';
      }
      if (L'\xffffffff' < local_34) {
        local_54 = local_64;
        if (local_64 < L'\0') {
          local_54 = L'\0';
        }
        mon_inc_timed(mon,local_34,local_54,L'\0');
      }
    }
  }
  else {
    square_destroy_decoy((chunk *)cave,grid);
  }
  return true;
}

Assistant:

bool effect_handler_TIMED_INC(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	/* Destroy decoy if it's a monster attack */
	if (cave->mon_current > 0 && decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* Check for monster targeting another monster */
	if (t_mon) {
		int mon_tmd_effect = -1;

		/* Will do until monster and player timed effects are fused */
		switch (context->subtype) {
			case TMD_CONFUSED: {
				mon_tmd_effect = MON_TMD_CONF;
				break;
			}
			case TMD_SLOW: {
				mon_tmd_effect = MON_TMD_SLOW;
				break;
			}
			case TMD_PARALYZED: {
				mon_tmd_effect = MON_TMD_HOLD;
				break;
			}
			case TMD_BLIND: {
				mon_tmd_effect = MON_TMD_STUN;
				break;
			}
			case TMD_AFRAID: {
				mon_tmd_effect = MON_TMD_FEAR;
				break;
			}
			case TMD_AMNESIA: {
				mon_tmd_effect = MON_TMD_SLEEP;
				break;
			}
			default: {
				break;
			}
		}
		if (mon_tmd_effect >= 0) {
			mon_inc_timed(t_mon, mon_tmd_effect, MAX(amount, 0), 0);
		}
		return true;
	}

	if (!player->timed[context->subtype] || !context->other) {
		player_inc_timed(player, context->subtype, MAX(amount, 0), true,
			context->origin.what != SRC_PLAYER || !context->aware,
			true);
	} else {
		player_inc_timed(player, context->subtype, context->other, true,
			context->origin.what != SRC_PLAYER || !context->aware,
			true);
	}
	return true;
}